

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

UGroup * re2::LookupGroup(StringPiece *name,UGroup *groups,int ngroups)

{
  UGroup *pUVar1;
  bool bVar2;
  UGroup *pUVar3;
  long lVar4;
  StringPiece local_30;
  
  if (ngroups < 1) {
    ngroups = 0;
  }
  lVar4 = (ulong)(uint)ngroups + 1;
  pUVar3 = groups + -1;
  do {
    lVar4 = lVar4 + -1;
    if (lVar4 == 0) {
      return (UGroup *)0x0;
    }
    pUVar1 = pUVar3 + 1;
    pUVar3 = pUVar3 + 1;
    StringPiece::StringPiece(&local_30,pUVar1->name);
    bVar2 = StringPiece::_equal(&local_30,name);
  } while (!bVar2);
  return pUVar3;
}

Assistant:

static const UGroup* LookupGroup(const StringPiece& name,
                                 const UGroup *groups, int ngroups) {
  // Simple name lookup.
  for (int i = 0; i < ngroups; i++)
    if (StringPiece(groups[i].name) == name)
      return &groups[i];
  return NULL;
}